

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O0

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
mocker::LoopInvariantCodeMotion::findLoopInvariantComputation
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LoopInvariantCodeMotion *this,size_t header,UseDefChain *useDef)

{
  bool bVar1;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  mapped_type *s;
  InstList *pIVar2;
  const_reference v;
  element_type *peVar3;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  reference puVar6;
  BasicBlock *this_01;
  reference pvVar7;
  element_type *peVar8;
  reference addr;
  Def *this_02;
  shared_ptr<mocker::ir::IRInst> *psVar9;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar10;
  InstID local_2c0;
  undefined1 local_2b8 [8];
  shared_ptr<mocker::ir::IRInst> def;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range2_1;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  InstID local_250;
  undefined1 local_248 [8];
  value_type inst_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  related;
  shared_ptr<mocker::ir::Call> call;
  InstID local_1e0;
  undefined1 local_1d8 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  unsigned_long *node;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  _Invoker_type *local_178;
  LoopInvariantCodeMotion *local_170;
  undefined1 local_168 [8];
  function<void_(unsigned_long)> visit;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mustPass;
  size_t local_128;
  size_t elseLabel;
  size_t thenLabel;
  shared_ptr<mocker::ir::Branch> br;
  BasicBlock *headerBB;
  queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
  worklist;
  undefined1 local_a0 [8];
  RegSet loopInvVars;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  res;
  mapped_type *loopNodes;
  UseDefChain *useDef_local;
  size_t header_local;
  LoopInvariantCodeMotion *this_local;
  
  useDef_local = (UseDefChain *)header;
  header_local = (size_t)this;
  this_local = (LoopInvariantCodeMotion *)__return_storage_ptr__;
  this_00 = LoopInfo::getLoops(&this->loopTree);
  s = std::
      unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::at(this_00,(key_type *)&useDef_local);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&loopInvVars._M_h._M_single_bucket);
  LoopInfo::getLoopInvariantVariables((RegSet *)local_a0,&this->loopTree,(size_t)useDef_local);
  std::
  queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
  ::
  queue<std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>,void>
            ((queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
              *)&headerBB);
  br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,(size_t)useDef_local);
  pIVar2 = ir::BasicBlock::getInsts_abi_cxx11_
                     ((BasicBlock *)
                      br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  v = std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ::back(pIVar2);
  ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&thenLabel,v);
  peVar3 = std::__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&thenLabel);
  p_Var4 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           ir::Branch::getThen(peVar3);
  peVar5 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var4);
  elseLabel = ir::Label::getID(peVar5);
  peVar3 = std::__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&thenLabel);
  p_Var4 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           ir::Branch::getElse(peVar3);
  peVar5 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var4);
  local_128 = ir::Label::getID(peVar5);
  bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                    (s,&local_128);
  if (bVar1) {
    std::swap<unsigned_long>(&elseLabel,&local_128);
  }
  bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                    (s,&local_128);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x38);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(__return_storage_ptr__);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&visit._M_invoker);
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168;
    local_178 = &visit._M_invoker;
    local_170 = this;
    std::function<void(unsigned_long)>::
    function<mocker::LoopInvariantCodeMotion::findLoopInvariantComputation(unsigned_long,mocker::UseDefChain_const&)::__0,void>
              ((function<void(unsigned_long)> *)__range1,(anon_class_24_3_4363da78 *)&__range1);
    std::function<void_(unsigned_long)>::operator()
              ((function<void_(unsigned_long)> *)local_168,elseLabel);
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&visit._M_invoker);
    node = (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&visit._M_invoker);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&node), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1);
      this_01 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,*puVar6);
      pIVar2 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
      __end2 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(pIVar2);
      inst = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar2);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
        dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
        ir::getDest((ir *)local_1d8,
                    (shared_ptr<mocker::ir::IRInst> *)
                    dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d8);
        if ((bVar1) &&
           (bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                              ((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                                *)local_a0,(shared_ptr<mocker::ir::Reg> *)local_1d8), bVar1)) {
          peVar8 = std::
                   __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)dest.
                                   super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
          local_1e0 = ir::IRInst::getID(peVar8);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::emplace<unsigned_long>
                    ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&loopInvVars._M_h._M_single_bucket,&local_1e0);
          ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&related._M_h._M_single_bucket,
                     (shared_ptr<mocker::ir::IRInst> *)
                     dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)&related._M_h._M_single_bucket);
          if (bVar1) {
            std::
            queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
            ::emplace<std::shared_ptr<mocker::ir::IRInst>const&>
                      ((queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
                        *)&headerBB,
                       (shared_ptr<mocker::ir::IRInst> *)
                       dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::shared_ptr<mocker::ir::Call>::~shared_ptr
                    ((shared_ptr<mocker::ir::Call> *)&related._M_h._M_single_bucket);
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_1d8);
        std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&inst_1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    while (bVar1 = std::
                   queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
                   ::empty((queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
                            *)&headerBB), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar7 = std::
               queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
               ::front((queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
                        *)&headerBB);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                ((shared_ptr<mocker::ir::IRInst> *)local_248,pvVar7);
      std::
      queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
      ::pop((queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
             *)&headerBB);
      peVar8 = std::
               __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_248);
      local_250 = ir::IRInst::getID(peVar8);
      pVar10 = std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::emplace<unsigned_long>
                         ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&inst_1.
                              super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_250);
      operands.
      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar10.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           *)&__range2_1,(shared_ptr<mocker::ir::IRInst> *)local_248);
      __end2_1 = std::
                 vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          *)&__range2_1);
      operand = (shared_ptr<mocker::ir::Addr> *)
                std::
                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       *)&__range2_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                 *)&operand), bVar1) {
        addr = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
               ::operator*(&__end2_1);
        ir::dycLocalReg((ir *)&def.
                               super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,addr);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar1) {
          this_02 = UseDefChain::getDef(useDef,(shared_ptr<mocker::ir::Reg> *)
                                               &def.
                                                super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
          psVar9 = UseDefChain::Def::getInst(this_02);
          std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                    ((shared_ptr<mocker::ir::IRInst> *)local_2b8,psVar9);
          peVar8 = std::
                   __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2b8);
          local_2c0 = ir::IRInst::getID(peVar8);
          bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)&inst_1.
                                 super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,&local_2c0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            std::
            queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
            ::emplace<std::shared_ptr<mocker::ir::IRInst>&>
                      ((queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
                        *)&headerBB,(shared_ptr<mocker::ir::IRInst> *)local_2b8);
          }
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::IRInst> *)local_2b8);
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                  ((shared_ptr<mocker::ir::Reg> *)
                   &def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 *)&__range2_1);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)local_248);
    }
    intersectSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&loopInvVars._M_h._M_single_bucket,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&inst_1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(__return_storage_ptr__,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&loopInvVars._M_h._M_single_bucket);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&inst_1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&visit._M_invoker);
  }
  std::shared_ptr<mocker::ir::Branch>::~shared_ptr((shared_ptr<mocker::ir::Branch> *)&thenLabel);
  std::
  queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
  ::~queue((queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
            *)&headerBB);
  std::
  unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                    *)local_a0);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&loopInvVars._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<ir::InstID>
LoopInvariantCodeMotion::findLoopInvariantComputation(
    std::size_t header, const UseDefChain &useDef) {
  const auto &loopNodes = loopTree.getLoops().at(header);

  std::unordered_set<ir::InstID> res;

  auto loopInvVars = loopTree.getLoopInvariantVariables(header);
  std::queue<std::shared_ptr<ir::IRInst>> worklist;

  // we only hoist Calls that can not be avoided
  auto &headerBB = func.getBasicBlock(header);
  auto br = ir::dyc<ir::Branch>(headerBB.getInsts().back());
  auto thenLabel = br->getThen()->getID(), elseLabel = br->getElse()->getID();

  if (isIn(loopNodes, elseLabel))
    std::swap(thenLabel, elseLabel);

  if (isIn(loopNodes, elseLabel))
    return {};

  std::vector<std::size_t> mustPass;
  std::function<void(std::size_t)> visit = [&visit, &mustPass,
                                            this](std::size_t cur) {
    mustPass.emplace_back(cur);
    auto succs = func.getBasicBlock(cur).getSuccessors();
    if (succs.size() != 1)
      return;
    visit(succs.at(0));
  };
  visit(thenLabel);

  for (auto &node : mustPass) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest || !isIn(loopInvVars, dest))
        continue;
      res.emplace(inst->getID());
      if (auto call = ir::dyc<ir::Call>(inst)) {
        worklist.emplace(inst);
      }
    }
  }

  std::unordered_set<ir::InstID> related;
  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    related.emplace(inst->getID());
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      if (auto reg = ir::dycLocalReg(operand)) {
        auto def = useDef.getDef(reg).getInst();
        if (!isIn(related, def->getID()))
          worklist.emplace(def);
      }
    }
  }

  intersectSet(res, related);
  return res;
}